

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

QArrayDataPointer<QCss::StyleRule> *
QArrayDataPointer<QCss::StyleRule>::allocateGrow
          (QArrayDataPointer<QCss::StyleRule> *__return_storage_ptr__,
          QArrayDataPointer<QCss::StyleRule> *from,qsizetype n,GrowthPosition position)

{
  long lVar1;
  StyleRule *pSVar2;
  long lVar3;
  Data *pDVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  P _b;
  ulong uVar8;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = from->d;
  if (pDVar4 == (Data *)0x0) {
    lVar1 = 0;
    lVar3 = from->size;
    if (from->size < 1) {
      lVar3 = lVar1;
    }
    lVar3 = lVar3 + n;
  }
  else {
    lVar1 = (pDVar4->super_QArrayData).alloc;
    lVar3 = from->size;
    lVar5 = lVar3;
    if (lVar3 - lVar1 == 0 || lVar3 < lVar1) {
      lVar5 = lVar1;
    }
    lVar7 = (long)((long)from->ptr -
                  ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3
    ;
    if (position == GrowsAtEnd) {
      lVar7 = (lVar3 - lVar1) + lVar7 * 0x6db6db6db6db6db7;
    }
    else {
      lVar7 = lVar7 * -0x6db6db6db6db6db7;
    }
    lVar7 = lVar5 + n + lVar7;
    lVar3 = lVar7;
    if (lVar7 < lVar1) {
      lVar3 = lVar1;
    }
    if (((pDVar4->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
      lVar3 = lVar7;
    }
  }
  local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pSVar2 = (StyleRule *)QArrayData::allocate(&local_38,0x38,0x10,lVar3,(uint)(lVar3 <= lVar1));
  if (pSVar2 == (StyleRule *)0x0 || local_38 == (QArrayData *)0x0) goto LAB_005ec458;
  if (position == GrowsAtBeginning) {
    uVar8 = (local_38->alloc - (n + from->size)) / 2;
    uVar6 = 0;
    if ((long)uVar8 < 1) {
      uVar8 = uVar6;
    }
    pDVar4 = from->d;
    pSVar2 = pSVar2 + n + uVar8;
    if (pDVar4 != (Data *)0x0) {
LAB_005ec44e:
      uVar6 = (ulong)(pDVar4->super_QArrayData).flags.
                     super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
                     super_QFlagsStorage<QArrayData::ArrayOption>.i;
    }
  }
  else {
    pDVar4 = from->d;
    if (pDVar4 != (Data *)0x0) {
      pSVar2 = (StyleRule *)
               ((long)pSVar2 +
               ((long)from->ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)));
      goto LAB_005ec44e;
    }
    uVar6 = 0;
  }
  (local_38->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
  super_QFlagsStorage<QArrayData::ArrayOption>.i = (Int)uVar6;
LAB_005ec458:
  __return_storage_ptr__->d = (Data *)local_38;
  __return_storage_ptr__->ptr = pSVar2;
  __return_storage_ptr__->size = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static QArrayDataPointer allocateGrow(const QArrayDataPointer &from, qsizetype n, QArrayData::GrowthPosition position)
    {
        // calculate new capacity. We keep the free capacity at the side that does not have to grow
        // to avoid quadratic behavior with mixed append/prepend cases

        // use qMax below, because constAllocatedCapacity() can be 0 when using fromRawData()
        qsizetype minimalCapacity = qMax(from.size, from.constAllocatedCapacity()) + n;
        // subtract the free space at the side we want to allocate. This ensures that the total size requested is
        // the existing allocation at the other side + size + n.
        minimalCapacity -= (position == QArrayData::GrowsAtEnd) ? from.freeSpaceAtEnd() : from.freeSpaceAtBegin();
        qsizetype capacity = from.detachCapacity(minimalCapacity);
        const bool grows = capacity > from.constAllocatedCapacity();
        auto [header, dataPtr] = Data::allocate(capacity, grows ? QArrayData::Grow : QArrayData::KeepSize);
        const bool valid = header != nullptr && dataPtr != nullptr;
        if (!valid)
            return QArrayDataPointer(header, dataPtr);

        // Idea: * when growing backwards, adjust pointer to prepare free space at the beginning
        //       * when growing forward, adjust by the previous data pointer offset
        dataPtr += (position == QArrayData::GrowsAtBeginning)
                ? n + qMax(0, (header->alloc - from.size - n) / 2)
                : from.freeSpaceAtBegin();
        header->flags = from.flags();
        return QArrayDataPointer(header, dataPtr);
    }